

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O3

void duckdb::StringSplitRegexFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  DataChunk *this;
  bool bVar6;
  BoundFunctionExpression *pBVar7;
  pointer pFVar8;
  reference pvVar9;
  ulong uVar10;
  idx_t iVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  long lVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  ulong uVar15;
  idx_t *piVar16;
  idx_t idx_in_entry;
  ulong uVar17;
  data_ptr_t pdVar18;
  idx_t idx_in_entry_1;
  idx_t iVar19;
  string_t input;
  string_t input_00;
  string_t delim;
  string_t delim_00;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat delim_data;
  StringSplitInput local_108;
  Vector *local_f0;
  SelectionVector *local_e8;
  SelectionVector *local_e0;
  DataChunk *local_d8;
  idx_t local_d0;
  buffer_ptr<ValidityBuffer> *local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  pBVar7 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar8 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar7->bind_info);
  local_d8 = args;
  if (*(char *)&pFVar8[8]._vptr_FunctionData == '\x01') {
    local_c0.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
    optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
              ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_c0);
    local_e8 = local_c0.sel;
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::ToUnifiedFormat(pvVar9,args->count,&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
    Vector::ToUnifiedFormat(pvVar9,args->count,&local_78);
    local_e0 = (SelectionVector *)local_78.data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    ListVector::SetListSize(result,0);
    pdVar18 = result->data;
    local_f0 = ListVector::GetEntry(result);
    FlatVector::VerifyFlatVector(result);
    if (args->count == 0) {
      iVar19 = 0;
    }
    else {
      local_e8 = (SelectionVector *)&local_e8->selection_data;
      local_c8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      piVar16 = (idx_t *)(pdVar18 + 8);
      iVar19 = 0;
      uVar17 = 0;
      do {
        peVar1 = (((original *)&(local_c0.sel)->sel_vector)->
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        uVar10 = uVar17;
        if (peVar1 != (element_type *)0x0) {
          uVar10 = (ulong)*(uint *)((long)&(peVar1->owned_data).
                                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                           ._M_t.
                                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                   + uVar17 * 4);
        }
        uVar15 = uVar17;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar15 = (ulong)(local_78.sel)->sel_vector[uVar17];
        }
        if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10 >> 6]
             >> (uVar10 & 0x3f) & 1) != 0)) {
          local_108.result_child = local_f0;
          local_108.offset = iVar19;
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)) {
            input.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar10 * 0x10 + 8);
            input.value._0_8_ = *(undefined8 *)(local_c0.data + uVar10 * 0x10);
            delim.value.pointer.ptr =
                 (char *)(&local_e0->selection_data)[uVar15].internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
            delim.value._0_8_ =
                 ((original *)&local_e0->sel_vector)[uVar15].
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            local_108.result_list = result;
            iVar11 = StringSplitter::Split<duckdb::ConstantRegexpStringSplit>
                               (input,delim,&local_108,local_e8);
          }
          else {
            lVar13 = uVar10 * 0x10;
            if ((ulong)*(uint *)(local_c0.data + lVar13) < 0xd) {
              pdVar18 = local_c0.data + lVar13 + 4;
            }
            else {
              pdVar18 = *(data_ptr_t *)(local_c0.data + lVar13 + 8);
            }
            iVar11 = 1;
            local_108.result_list = result;
            StringSplitInput::AddSplit
                      (&local_108,(char *)pdVar18,(ulong)*(uint *)(local_c0.data + lVar13),0);
          }
          *piVar16 = iVar11;
          piVar16[-1] = iVar19;
          iVar19 = iVar19 + iVar11;
        }
        else {
          _Var14._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_108,&local_d0);
            pVVar5 = local_108.result_child;
            pVVar4 = local_108.result_list;
            local_108.result_list = (Vector *)0x0;
            local_108.result_child = (Vector *)0x0;
            p_Var2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pVVar4;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVVar5;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               local_108.result_child != (Vector *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.result_child);
            }
            pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_c8);
            _Var14._M_head_impl =
                 (pTVar12->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var14._M_head_impl;
          }
          bVar3 = (byte)uVar17 & 0x3f;
          _Var14._M_head_impl[uVar17 >> 6] =
               _Var14._M_head_impl[uVar17 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        uVar17 = uVar17 + 1;
        piVar16 = piVar16 + 2;
      } while (uVar17 < local_d8->count);
    }
    ListVector::SetListSize(result,iVar19);
    this = local_d8;
    bVar6 = DataChunk::AllConstant(local_d8);
    if (bVar6) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&this->data,0);
    StringVector::AddHeapReference(local_f0,pvVar9);
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::ToUnifiedFormat(pvVar9,args->count,&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
    Vector::ToUnifiedFormat(pvVar9,args->count,&local_78);
    local_e8 = (SelectionVector *)local_78.data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    ListVector::SetListSize(result,0);
    pdVar18 = result->data;
    local_f0 = ListVector::GetEntry(result);
    FlatVector::VerifyFlatVector(result);
    if (args->count == 0) {
      iVar19 = 0;
    }
    else {
      local_e0 = (SelectionVector *)
                 &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      piVar16 = (idx_t *)(pdVar18 + 8);
      iVar19 = 0;
      uVar17 = 0;
      do {
        peVar1 = (((original *)&(local_c0.sel)->sel_vector)->
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        uVar10 = uVar17;
        if (peVar1 != (element_type *)0x0) {
          uVar10 = (ulong)*(uint *)((long)&(peVar1->owned_data).
                                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                           ._M_t.
                                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                   + uVar17 * 4);
        }
        uVar15 = uVar17;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar15 = (ulong)(local_78.sel)->sel_vector[uVar17];
        }
        if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10 >> 6]
             >> (uVar10 & 0x3f) & 1) != 0)) {
          local_108.result_child = local_f0;
          local_108.offset = iVar19;
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)) {
            input_00.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar10 * 0x10 + 8);
            input_00.value._0_8_ = *(undefined8 *)(local_c0.data + uVar10 * 0x10);
            delim_00.value.pointer.ptr =
                 (char *)(&local_e8->selection_data)[uVar15].internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
            delim_00.value._0_8_ =
                 ((original *)&local_e8->sel_vector)[uVar15].
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            local_108.result_list = result;
            iVar11 = StringSplitter::Split<duckdb::RegexpStringSplit>
                               (input_00,delim_00,&local_108,(void *)0x0);
          }
          else {
            lVar13 = uVar10 * 0x10;
            if ((ulong)*(uint *)(local_c0.data + lVar13) < 0xd) {
              pdVar18 = local_c0.data + lVar13 + 4;
            }
            else {
              pdVar18 = *(data_ptr_t *)(local_c0.data + lVar13 + 8);
            }
            iVar11 = 1;
            local_108.result_list = result;
            StringSplitInput::AddSplit
                      (&local_108,(char *)pdVar18,(ulong)*(uint *)(local_c0.data + lVar13),0);
          }
          *piVar16 = iVar11;
          piVar16[-1] = iVar19;
          iVar19 = iVar19 + iVar11;
          args = local_d8;
        }
        else {
          _Var14._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_108,&local_d0);
            pVVar5 = local_108.result_child;
            pVVar4 = local_108.result_list;
            local_108.result_list = (Vector *)0x0;
            local_108.result_child = (Vector *)0x0;
            p_Var2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pVVar4;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVVar5;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               local_108.result_child != (Vector *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.result_child);
            }
            pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 local_e0);
            _Var14._M_head_impl =
                 (pTVar12->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var14._M_head_impl;
          }
          bVar3 = (byte)uVar17 & 0x3f;
          _Var14._M_head_impl[uVar17 >> 6] =
               _Var14._M_head_impl[uVar17 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        uVar17 = uVar17 + 1;
        piVar16 = piVar16 + 2;
      } while (uVar17 < args->count);
    }
    ListVector::SetListSize(result,iVar19);
    bVar6 = DataChunk::AllConstant(args);
    if (bVar6) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    StringVector::AddHeapReference(local_f0,pvVar9);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void StringSplitRegexFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RegexpMatchesBindData>();
	if (info.constant_pattern) {
		// fast path: pre-compiled regex
		auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RegexLocalState>();
		StringSplitExecutor<ConstantRegexpStringSplit>(args, state, result, &lstate.constant_pattern);
	} else {
		// slow path: have to re-compile regex for every row
		StringSplitExecutor<RegexpStringSplit>(args, state, result);
	}
}